

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::BinaryBinsSelectExprSyntax::setChild
          (BinaryBinsSelectExprSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  BinsSelectExpressionSyntax *local_150;
  BinsSelectExpressionSyntax *local_148;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BinsSelectExpressionSyntax *local_48;
  BinsSelectExpressionSyntax *local_40;
  undefined8 local_38;
  Info *local_30;
  BinsSelectExpressionSyntax *local_28;
  BinsSelectExpressionSyntax *local_20;
  size_t local_18;
  size_t index_local;
  BinaryBinsSelectExprSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_148 = (BinsSelectExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_148 = SyntaxNode::as<slang::syntax::BinsSelectExpressionSyntax>(pSVar1);
    }
    local_28 = local_148;
    not_null<slang::syntax::BinsSelectExpressionSyntax*>::
    not_null<slang::syntax::BinsSelectExpressionSyntax*,void>
              ((not_null<slang::syntax::BinsSelectExpressionSyntax*> *)&local_20,&local_28);
    (this->left).ptr = local_20;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->op).kind = (undefined2)local_38;
    (this->op).field_0x2 = local_38._2_1_;
    (this->op).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->op).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->op).info = local_30;
  }
  else {
    if (index != 2) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_e9);
      std::operator+(&local_c8,&local_e8,":");
      std::__cxx11::to_string(&local_120,0x427);
      std::operator+(&local_a8,&local_c8,&local_120);
      std::operator+(&local_88,&local_a8,": ");
      std::operator+(&local_68,&local_88,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_68);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_150 = (BinsSelectExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_150 = SyntaxNode::as<slang::syntax::BinsSelectExpressionSyntax>(pSVar1);
    }
    local_48 = local_150;
    not_null<slang::syntax::BinsSelectExpressionSyntax*>::
    not_null<slang::syntax::BinsSelectExpressionSyntax*,void>
              ((not_null<slang::syntax::BinsSelectExpressionSyntax*> *)&local_40,&local_48);
    (this->right).ptr = local_40;
  }
  return;
}

Assistant:

void BinaryBinsSelectExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<BinsSelectExpressionSyntax>() : nullptr; return;
        case 1: op = child.token(); return;
        case 2: right = child.node() ? &child.node()->as<BinsSelectExpressionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}